

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<unsigned_char> __thiscall wasm::WATParser::Lexer::takeI<unsigned_char>(Lexer *this)

{
  bool bVar1;
  LexIntResult *pLVar2;
  size_type sVar3;
  uchar local_51;
  string_view local_50;
  undefined1 local_40 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> result;
  Lexer *this_local;
  
  result.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = this;
  local_50 = next(this);
  anon_unknown_0::integer
            ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40,local_50);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_40);
  if (bVar1) {
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    bVar1 = anon_unknown_0::LexIntResult::isUnsigned<unsigned_char>(pLVar2);
    if (!bVar1) {
      pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                         ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40
                         );
      bVar1 = anon_unknown_0::LexIntResult::isSigned<signed_char>(pLVar2);
      if (!bVar1) goto LAB_0232297e;
    }
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)pLVar2);
    this->pos = sVar3 + this->pos;
    advance(this);
    pLVar2 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::operator->
                       ((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_40);
    local_51 = (uchar)pLVar2->n;
    std::optional<unsigned_char>::optional<unsigned_char,_true>
              ((optional<unsigned_char> *)((long)&this_local + 6),&local_51);
  }
  else {
LAB_0232297e:
    std::optional<unsigned_char>::optional((optional<unsigned_char> *)((long)&this_local + 6));
  }
  return (_Optional_base<unsigned_char,_true,_true>)
         (_Optional_base<unsigned_char,_true,_true>)this_local._6_2_;
}

Assistant:

std::optional<T> Lexer::takeI() {
  static_assert(std::is_integral_v<T> && std::is_unsigned_v<T>);
  if (auto result = integer(next())) {
    if (result->isUnsigned<T>() || result->isSigned<std::make_signed_t<T>>()) {
      pos += result->span.size();
      advance();
      return T(result->n);
    }
  }
  return std::nullopt;
}